

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conditionalestimator.cxx
# Opt level: O0

Matrix * __thiscall
ConditionalEstimator::getEstimate
          (Matrix *__return_storage_ptr__,ConditionalEstimator *this,Property *p)

{
  int iVar1;
  ostream *this_00;
  void *this_01;
  double dVar2;
  double dVar3;
  double dVar4;
  double local_25a8;
  Matrix local_2588;
  Matrix local_2488;
  Matrix local_2388;
  Matrix local_2288;
  Matrix local_2188;
  Matrix local_2088;
  Matrix local_1f88;
  Matrix local_1e88;
  Matrix local_1d88;
  int local_1c88;
  int local_1c84;
  int i_4;
  int j;
  string local_1c60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1be0;
  allocator<char> local_1bb9;
  string local_1bb8;
  undefined1 local_1b95;
  int local_1b94;
  undefined1 local_1b90 [4];
  int timeSize;
  Matrix local_1a90;
  double local_1990;
  double mean;
  Matrix local_1888;
  int local_1784;
  undefined1 local_1780 [4];
  int i_3;
  string local_1760;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1740;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1720;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1700;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_16e0;
  allocator<char> local_16b9;
  string local_16b8;
  undefined1 local_1698 [8];
  Graph a_3;
  Matrix local_1498;
  Matrix local_1398;
  Matrix local_1298;
  int local_1194;
  undefined1 local_1190 [4];
  int i_2;
  string local_1170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10f0;
  allocator<char> local_10c9;
  string local_10c8;
  undefined1 local_10a8 [8];
  Graph a_2;
  Matrix local_ea8;
  Matrix local_da8;
  Matrix local_ca8;
  int local_ba4;
  undefined1 local_ba0 [4];
  int i_1;
  Physical local_b08;
  Physical local_a70;
  string local_9d8;
  string local_9b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_998;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_978;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_958;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_938;
  allocator<char> local_911;
  string local_910;
  undefined1 local_8f0 [8];
  Graph a_1;
  Matrix local_6f0;
  Matrix local_5f0;
  Matrix local_4f0;
  int local_3ec;
  undefined1 local_3e8 [4];
  int i;
  Physical local_350;
  Physical local_2b8;
  string local_220;
  string local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  allocator<char> local_149;
  string local_148;
  undefined1 local_128 [8];
  Graph a;
  double samples;
  Property *p_local;
  ConditionalEstimator *this_local;
  Matrix *a_4;
  
  dVar2 = (double)(this->super_Estimator).nSamples;
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    local_25a8 = (double)(this->super_Estimator).nSamples;
  }
  else {
    local_25a8 = 1.0;
  }
  a.super_Matrix.sMatrixName.field_2._8_8_ = local_25a8;
  if (((this->super_Estimator).nEstimate & 0x40U) != 0) {
    this_00 = std::operator<<((ostream *)&std::cout,"multiplying by dt: ");
    this_01 = (void *)std::ostream::operator<<(this_00,((this->super_Estimator).estimatorTime)->dt);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    a.super_Matrix.sMatrixName.field_2._8_8_ =
         (size_type)
         (((this->super_Estimator).estimatorTime)->dt * a.super_Matrix.sMatrixName.field_2._8_8_);
  }
  if ((*p & (this->super_Estimator).nEstimate & 1U) == 0) {
    if ((*p & (this->super_Estimator).nEstimate & 4U) == 0) {
      if ((*p & (this->super_Estimator).nEstimate & 0x20U) == 0) {
        if ((*p & (this->super_Estimator).nEstimate & 8U) == 0) {
          if ((*p & (this->super_Estimator).nEstimate & 2U) == 0) {
            Matrix::Matrix(__return_storage_ptr__);
          }
          else {
            local_1b94 = this->nPre + 1 + this->nPost;
            local_1b95 = 0;
            Matrix::Matrix(__return_storage_ptr__,local_1b94,this->nDist,3);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1bb8,"conditional density",&local_1bb9);
            Matrix::setName(__return_storage_ptr__,&local_1bb8);
            std::__cxx11::string::~string((string *)&local_1bb8);
            std::allocator<char>::~allocator(&local_1bb9);
            if ((this->super_Estimator).pSource != (StochasticProcess *)0x0) {
              Parametric::getName_abi_cxx11_
                        (&local_1c60,&((this->super_Estimator).pSource)->super_Parametric);
              std::operator+(&local_1c40,"conditional density of ",&local_1c60);
              std::operator+(&local_1c20,&local_1c40," (");
              Parametric::getType_abi_cxx11_
                        ((string *)&i_4,&((this->super_Estimator).pSource)->super_Parametric);
              std::operator+(&local_1c00,&local_1c20,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &i_4);
              std::operator+(&local_1be0,&local_1c00,")");
              Matrix::setName(__return_storage_ptr__,&local_1be0);
              std::__cxx11::string::~string((string *)&local_1be0);
              std::__cxx11::string::~string((string *)&local_1c00);
              std::__cxx11::string::~string((string *)&i_4);
              std::__cxx11::string::~string((string *)&local_1c20);
              std::__cxx11::string::~string((string *)&local_1c40);
              std::__cxx11::string::~string((string *)&local_1c60);
            }
            for (local_1c84 = 0; local_1c84 < this->nDist; local_1c84 = local_1c84 + 1) {
              for (local_1c88 = 0; local_1c88 < local_1b94; local_1c88 = local_1c88 + 1) {
                dVar2 = ((this->super_Estimator).estimatorTime)->dt;
                dVar4 = (double)local_1c88;
                iVar1 = this->nPre;
                Matrix::operator[](&local_1f88,__return_storage_ptr__,local_1c88);
                Matrix::operator[](&local_1e88,&local_1f88,local_1c84);
                Matrix::operator[](&local_1d88,&local_1e88,0);
                Matrix::operator=(&local_1d88,dVar2 * (dVar4 - (double)iVar1));
                Matrix::~Matrix(&local_1d88);
                Matrix::~Matrix(&local_1e88);
                Matrix::~Matrix(&local_1f88);
                dVar3 = (double)local_1c84;
                dVar2 = this->dDistOffset;
                dVar4 = this->dDistScale;
                Matrix::operator[](&local_2288,__return_storage_ptr__,local_1c88);
                Matrix::operator[](&local_2188,&local_2288,local_1c84);
                Matrix::operator[](&local_2088,&local_2188,1);
                Matrix::operator=(&local_2088,dVar3 * dVar4 + dVar2);
                Matrix::~Matrix(&local_2088);
                Matrix::~Matrix(&local_2188);
                Matrix::~Matrix(&local_2288);
                dVar2 = this->aDist[local_1c88][local_1c84] /
                        (double)a.super_Matrix.sMatrixName.field_2._8_8_;
                Matrix::operator[](&local_2588,__return_storage_ptr__,local_1c88);
                Matrix::operator[](&local_2488,&local_2588,local_1c84);
                Matrix::operator[](&local_2388,&local_2488,2);
                Matrix::operator=(&local_2388,dVar2);
                Matrix::~Matrix(&local_2388);
                Matrix::~Matrix(&local_2488);
                Matrix::~Matrix(&local_2588);
              }
            }
          }
        }
        else {
          Graph::Graph((Graph *)local_1698,this->nPre + 1 + this->nPost);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_16b8,"conditional variance",&local_16b9);
          Matrix::setName((Matrix *)local_1698,&local_16b8);
          std::__cxx11::string::~string((string *)&local_16b8);
          std::allocator<char>::~allocator(&local_16b9);
          if ((this->super_Estimator).pSource != (StochasticProcess *)0x0) {
            Parametric::getName_abi_cxx11_
                      (&local_1760,&((this->super_Estimator).pSource)->super_Parametric);
            std::operator+(&local_1740,"conditional variance of ",&local_1760);
            std::operator+(&local_1720,&local_1740," (");
            Parametric::getType_abi_cxx11_
                      ((string *)local_1780,&((this->super_Estimator).pSource)->super_Parametric);
            std::operator+(&local_1700,&local_1720,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1780);
            std::operator+(&local_16e0,&local_1700,")");
            Matrix::setName((Matrix *)local_1698,&local_16e0);
            std::__cxx11::string::~string((string *)&local_16e0);
            std::__cxx11::string::~string((string *)&local_1700);
            std::__cxx11::string::~string((string *)local_1780);
            std::__cxx11::string::~string((string *)&local_1720);
            std::__cxx11::string::~string((string *)&local_1740);
            std::__cxx11::string::~string((string *)&local_1760);
          }
          for (local_1784 = 0; local_1784 < this->nPre + this->nPost + 1;
              local_1784 = local_1784 + 1) {
            dVar2 = ((this->super_Estimator).estimatorTime)->dt;
            dVar4 = (double)local_1784;
            iVar1 = this->nPre;
            Matrix::operator[]((Matrix *)&mean,(Matrix *)local_1698,local_1784);
            Matrix::operator[](&local_1888,(Matrix *)&mean,0);
            Matrix::operator=(&local_1888,dVar2 * (dVar4 - (double)iVar1));
            Matrix::~Matrix(&local_1888);
            Matrix::~Matrix((Matrix *)&mean);
            local_1990 = this->aOne[local_1784] / (double)a.super_Matrix.sMatrixName.field_2._8_8_;
            dVar2 = this->aTwo[local_1784] / (double)a.super_Matrix.sMatrixName.field_2._8_8_;
            dVar4 = local_1990 * local_1990;
            Matrix::operator[]((Matrix *)local_1b90,(Matrix *)local_1698,local_1784);
            Matrix::operator[](&local_1a90,(Matrix *)local_1b90,1);
            Matrix::operator=(&local_1a90,dVar2 - dVar4);
            Matrix::~Matrix(&local_1a90);
            Matrix::~Matrix((Matrix *)local_1b90);
          }
          Matrix::Matrix(__return_storage_ptr__,(Matrix *)local_1698);
          Graph::~Graph((Graph *)local_1698);
        }
      }
      else {
        Graph::Graph((Graph *)local_10a8,this->nPre + 1 + this->nPost);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_10c8,"conditional auto-correlation",&local_10c9);
        Matrix::setName((Matrix *)local_10a8,&local_10c8);
        std::__cxx11::string::~string((string *)&local_10c8);
        std::allocator<char>::~allocator(&local_10c9);
        if ((this->super_Estimator).pSource != (StochasticProcess *)0x0) {
          Parametric::getName_abi_cxx11_
                    (&local_1170,&((this->super_Estimator).pSource)->super_Parametric);
          std::operator+(&local_1150,"conditional auto-correlation of ",&local_1170);
          std::operator+(&local_1130,&local_1150," (");
          Parametric::getType_abi_cxx11_
                    ((string *)local_1190,&((this->super_Estimator).pSource)->super_Parametric);
          std::operator+(&local_1110,&local_1130,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1190);
          std::operator+(&local_10f0,&local_1110,")");
          Matrix::setName((Matrix *)local_10a8,&local_10f0);
          std::__cxx11::string::~string((string *)&local_10f0);
          std::__cxx11::string::~string((string *)&local_1110);
          std::__cxx11::string::~string((string *)local_1190);
          std::__cxx11::string::~string((string *)&local_1130);
          std::__cxx11::string::~string((string *)&local_1150);
          std::__cxx11::string::~string((string *)&local_1170);
        }
        for (local_1194 = 0; local_1194 < this->nPre + this->nPost + 1; local_1194 = local_1194 + 1)
        {
          dVar2 = ((this->super_Estimator).estimatorTime)->dt;
          dVar4 = (double)local_1194;
          iVar1 = this->nPre;
          Matrix::operator[](&local_1398,(Matrix *)local_10a8,local_1194);
          Matrix::operator[](&local_1298,&local_1398,0);
          Matrix::operator=(&local_1298,dVar2 * ((dVar4 - (double)iVar1) + 1.0));
          Matrix::~Matrix(&local_1298);
          Matrix::~Matrix(&local_1398);
          dVar2 = this->aEvents[local_1194] / (double)a.super_Matrix.sMatrixName.field_2._8_8_;
          Matrix::operator[]((Matrix *)((long)&a_3.super_Matrix.sMatrixName.field_2 + 8),
                             (Matrix *)local_10a8,local_1194);
          Matrix::operator[](&local_1498,(Matrix *)((long)&a_3.super_Matrix.sMatrixName.field_2 + 8)
                             ,1);
          Matrix::operator=(&local_1498,dVar2);
          Matrix::~Matrix(&local_1498);
          Matrix::~Matrix((Matrix *)((long)&a_3.super_Matrix.sMatrixName.field_2 + 8));
        }
        Matrix::Matrix(__return_storage_ptr__,(Matrix *)local_10a8);
        Graph::~Graph((Graph *)local_10a8);
      }
    }
    else {
      Graph::Graph((Graph *)local_8f0,this->nPre + 1 + this->nPost);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_910,"conditional mean",&local_911);
      Matrix::setName((Matrix *)local_8f0,&local_910);
      std::__cxx11::string::~string((string *)&local_910);
      std::allocator<char>::~allocator(&local_911);
      if ((this->super_Estimator).pSource != (StochasticProcess *)0x0) {
        Parametric::getName_abi_cxx11_
                  (&local_9b8,&((this->super_Estimator).pSource)->super_Parametric);
        std::operator+(&local_998,"conditional mean of ",&local_9b8);
        std::operator+(&local_978,&local_998," (");
        Parametric::getType_abi_cxx11_
                  (&local_9d8,&((this->super_Estimator).pSource)->super_Parametric);
        std::operator+(&local_958,&local_978,&local_9d8);
        std::operator+(&local_938,&local_958,")");
        Matrix::setName((Matrix *)local_8f0,&local_938);
        std::__cxx11::string::~string((string *)&local_938);
        std::__cxx11::string::~string((string *)&local_958);
        std::__cxx11::string::~string((string *)&local_9d8);
        std::__cxx11::string::~string((string *)&local_978);
        std::__cxx11::string::~string((string *)&local_998);
        std::__cxx11::string::~string((string *)&local_9b8);
        Physical::Physical(&local_a70,&((this->super_Estimator).pSource)->super_Physical);
        Matrix::setPhysical((Matrix *)local_8f0,&local_a70);
        Physical::~Physical(&local_a70);
        Physical::Physical(&local_b08,&((this->super_Estimator).estimatorTime)->super_Physical);
        Matrix::setPhysical((Matrix *)local_8f0,0,&local_b08);
        Physical::~Physical(&local_b08);
        Physical::Physical((Physical *)local_ba0,&((this->super_Estimator).pSource)->super_Physical)
        ;
        Matrix::setPhysical((Matrix *)local_8f0,1,(Physical *)local_ba0);
        Physical::~Physical((Physical *)local_ba0);
      }
      for (local_ba4 = 0; local_ba4 < this->nPre + this->nPost + 1; local_ba4 = local_ba4 + 1) {
        dVar2 = ((this->super_Estimator).estimatorTime)->dt;
        dVar4 = (double)local_ba4;
        iVar1 = this->nPre;
        Matrix::operator[](&local_da8,(Matrix *)local_8f0,local_ba4);
        Matrix::operator[](&local_ca8,&local_da8,0);
        Matrix::operator=(&local_ca8,dVar2 * (dVar4 - (double)iVar1));
        Matrix::~Matrix(&local_ca8);
        Matrix::~Matrix(&local_da8);
        dVar2 = this->aOne[local_ba4] / (double)a.super_Matrix.sMatrixName.field_2._8_8_;
        Matrix::operator[]((Matrix *)((long)&a_2.super_Matrix.sMatrixName.field_2 + 8),
                           (Matrix *)local_8f0,local_ba4);
        Matrix::operator[](&local_ea8,(Matrix *)((long)&a_2.super_Matrix.sMatrixName.field_2 + 8),1)
        ;
        Matrix::operator=(&local_ea8,dVar2);
        Matrix::~Matrix(&local_ea8);
        Matrix::~Matrix((Matrix *)((long)&a_2.super_Matrix.sMatrixName.field_2 + 8));
      }
      Matrix::Matrix(__return_storage_ptr__,(Matrix *)local_8f0);
      Graph::~Graph((Graph *)local_8f0);
    }
  }
  else {
    Graph::Graph((Graph *)local_128,this->nPre + 1 + this->nPost);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"sample",&local_149);
    Matrix::setName((Matrix *)local_128,&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    std::allocator<char>::~allocator(&local_149);
    if ((this->super_Estimator).pSource != (StochasticProcess *)0x0) {
      Parametric::getName_abi_cxx11_
                (&local_200,&((this->super_Estimator).pSource)->super_Parametric);
      std::operator+(&local_1e0,"conditional sample of ",&local_200);
      std::operator+(&local_1c0,&local_1e0," (");
      Parametric::getType_abi_cxx11_
                (&local_220,&((this->super_Estimator).pSource)->super_Parametric);
      std::operator+(&local_1a0,&local_1c0,&local_220);
      std::operator+(&local_180,&local_1a0,")");
      Matrix::setName((Matrix *)local_128,&local_180);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::~string((string *)&local_220);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::string::~string((string *)&local_200);
      Physical::Physical(&local_2b8,&((this->super_Estimator).pSource)->super_Physical);
      Matrix::setPhysical((Matrix *)local_128,&local_2b8);
      Physical::~Physical(&local_2b8);
      Physical::Physical(&local_350,&((this->super_Estimator).estimatorTime)->super_Physical);
      Matrix::setPhysical((Matrix *)local_128,0,&local_350);
      Physical::~Physical(&local_350);
      Physical::Physical((Physical *)local_3e8,&((this->super_Estimator).pSource)->super_Physical);
      Matrix::setPhysical((Matrix *)local_128,1,(Physical *)local_3e8);
      Physical::~Physical((Physical *)local_3e8);
    }
    for (local_3ec = 0; local_3ec < this->nPre + this->nPost + 1; local_3ec = local_3ec + 1) {
      dVar2 = ((this->super_Estimator).estimatorTime)->dt;
      dVar4 = (double)local_3ec;
      iVar1 = this->nPre;
      Matrix::operator[](&local_5f0,(Matrix *)local_128,local_3ec);
      Matrix::operator[](&local_4f0,&local_5f0,0);
      Matrix::operator=(&local_4f0,dVar2 * (dVar4 - (double)iVar1));
      Matrix::~Matrix(&local_4f0);
      Matrix::~Matrix(&local_5f0);
      dVar2 = this->condSamples[local_3ec];
      Matrix::operator[]((Matrix *)((long)&a_1.super_Matrix.sMatrixName.field_2 + 8),
                         (Matrix *)local_128,local_3ec);
      Matrix::operator[](&local_6f0,(Matrix *)((long)&a_1.super_Matrix.sMatrixName.field_2 + 8),1);
      Matrix::operator=(&local_6f0,dVar2);
      Matrix::~Matrix(&local_6f0);
      Matrix::~Matrix((Matrix *)((long)&a_1.super_Matrix.sMatrixName.field_2 + 8));
    }
    Matrix::Matrix(__return_storage_ptr__,(Matrix *)local_128);
    Graph::~Graph((Graph *)local_128);
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix ConditionalEstimator::getEstimate(const Property& p)
{
	double samples = (nSamples!=0.0)? double(nSamples): 1.0;
	if(nEstimate & EST_DIFF) {
		cout << "multiplying by dt: " << estimatorTime->dt << endl;
		samples *= estimatorTime->dt;
	}
	if(p & nEstimate & EST_SAMPLE) {
		Graph a(nPre+nPost+1);
		a.setName("sample");
		if( pSource ) {
			a.setName( "conditional sample of " + pSource->getName() + " (" + pSource->getType() + ")");
			a.setPhysical(*pSource);
			a.setPhysical(0, *estimatorTime );
			a.setPhysical(1, *pSource);
		}
		for(int i=0; i<nPre+nPost+1; i++) {
			a[i][0] = estimatorTime->dt * ((double) i - nPre);
			a[i][1] = condSamples[i];
		}
		return a;
	}		
	if(p & nEstimate & EST_MEAN) {
		Graph a(nPre+nPost+1);
		a.setName("conditional mean");
		if( pSource ) {
			a.setName( "conditional mean of " + pSource->getName() + " (" + pSource->getType() + ")");
			a.setPhysical(*pSource);
			a.setPhysical(0, *estimatorTime );
			a.setPhysical(1, *pSource);
		}
		for(int i=0; i<nPre+nPost+1; i++) {
			a[i][0] = estimatorTime->dt * ((double) i - nPre);
			a[i][1] = aOne[i] / samples;
		}
		return a;
	}
	if(p & nEstimate & EST_EVENTS) {
		Graph a(nPre+nPost+1);
		a.setName("conditional auto-correlation");
		if (pSource)
			a.setName("conditional auto-correlation of " + pSource->getName() + " (" + pSource->getType() + ")");
		for(int i=0; i<nPre+nPost+1; i++) {
			a[i][0] = estimatorTime->dt * ((double) i - nPre + 1);
			a[i][1] = aEvents[i] / samples;
		}
		return a;
	}
	else if(p & nEstimate & EST_VAR) {
		Graph a(nPre+nPost+1);
		a.setName("conditional variance");
		if (pSource)
			a.setName("conditional variance of " + pSource->getName() + " (" + pSource->getType() + ")");
		for(int i=0; i<nPre+nPost+1; i++) {
			a[i][0] = estimatorTime->dt * ((double) i - nPre);
			double mean = aOne[i] / samples;
			a[i][1] = (aTwo[i] / samples - mean*mean);
		}
		return a;
	}
	else if( p & nEstimate & EST_DENS ) {
		int timeSize = nPre+nPost+1;
		Matrix a(timeSize, nDist, 3);
		a.setName("conditional density");
		if (pSource)
			a.setName("conditional density of " + pSource->getName() + " (" + pSource->getType() + ")");
		for(int j=0; j<nDist; j++)
			for( int i=0; i<timeSize; i++ ) {
				a[i][j][0] = estimatorTime->dt * ((double) i - nPre);
				a[i][j][1] = (double(j) * dDistScale) + dDistOffset;
				a[i][j][2] = aDist[i][j] / samples;
			}
		return a;
	}
	return Matrix();
}